

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O3

int stb_vorbis_seek(stb_vorbis *f,uint sample_number)

{
  int iVar1;
  int iVar2;
  int n;
  int local_1c;
  
  iVar1 = stb_vorbis_seek_frame(f,sample_number);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    iVar1 = 1;
    iVar2 = sample_number - f->current_loc;
    if (iVar2 != 0) {
      stb_vorbis_get_frame_float(f,&local_1c,(float ***)0x0);
      f->channel_buffer_start = f->channel_buffer_start + iVar2;
    }
  }
  return iVar1;
}

Assistant:

int stb_vorbis_seek(stb_vorbis *f, unsigned int sample_number)
{
   if (!stb_vorbis_seek_frame(f, sample_number))
      return 0;

   if (sample_number != f->current_loc) {
      int n;
      uint32 frame_start = f->current_loc;
      stb_vorbis_get_frame_float(f, &n, NULL);
      assert(sample_number > frame_start);
      assert(f->channel_buffer_start + (int) (sample_number-frame_start) <= f->channel_buffer_end);
      f->channel_buffer_start += (sample_number - frame_start);
   }

   return 1;
}